

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

err_t SetParent(nodetree *p,nodetree *Parent,nodetree *Before)

{
  err_t local_28;
  err_t Result;
  nodetree *Before_local;
  nodetree *Parent_local;
  nodetree *p_local;
  
  local_28 = 0;
  if ((Before != (nodetree *)0x0) && (Before->Parent != Parent)) {
    __assert_fail("!Before || Before->Parent == Parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                  ,0xf,"err_t SetParent(nodetree *, nodetree *, nodetree *)");
  }
  if ((p != Before) && ((p->Parent != Parent || (p->Next != Before)))) {
    if (p->Parent != (nodetree *)0x0) {
      if (p->Parent == (nodetree *)0x0) {
        __assert_fail("(const void*)(p->Parent)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                      ,0x14,"err_t SetParent(nodetree *, nodetree *, nodetree *)");
      }
      (**(code **)((long)(p->Parent->Base).VMT + 0x58))(p->Parent,p);
    }
    if (Parent != (nodetree *)0x0) {
      if (Parent == (nodetree *)0x0) {
        __assert_fail("(const void*)(Parent)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                      ,0x17,"err_t SetParent(nodetree *, nodetree *, nodetree *)");
      }
      local_28 = (**(code **)((long)(Parent->Base).VMT + 0x50))(Parent,p,Before);
    }
    if (p->Next == p) {
      __assert_fail("p->Next != p",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                    ,0x18,"err_t SetParent(nodetree *, nodetree *, nodetree *)");
    }
  }
  return local_28;
}

Assistant:

static NOINLINE err_t SetParent(nodetree* p,nodetree* Parent,nodetree* Before)
{
    err_t Result = ERR_NONE;

    assert(!Before || Before->Parent == Parent); // make sure Before is in the right tree

	if (p!=Before && (p->Parent != Parent || p->Next != Before))
    {
	    if (p->Parent)
            VMT_FUNC(p->Parent,nodetree_vmt)->RemoveChild(p->Parent,p);

	    if (Parent)
            Result = VMT_FUNC(Parent,nodetree_vmt)->AddChild(Parent,p,Before);
        assert(p->Next != p);
    }
    return Result;
}